

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_array_splitting.cpp
# Opt level: O0

void __thiscall
ir_array_splitting_visitor::handle_rvalue(ir_array_splitting_visitor *this,ir_rvalue **rvalue)

{
  ir_dereference *local_20;
  ir_dereference *deref;
  ir_rvalue **rvalue_local;
  ir_array_splitting_visitor *this_local;
  
  if ((*rvalue != (ir_rvalue *)0x0) &&
     (deref = (ir_dereference *)rvalue, rvalue_local = (ir_rvalue **)this,
     local_20 = ir_instruction::as_dereference(&(*rvalue)->super_ir_instruction),
     local_20 != (ir_dereference *)0x0)) {
    split_deref(this,&local_20);
    (deref->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction = (_func_int **)local_20;
  }
  return;
}

Assistant:

void
ir_array_splitting_visitor::handle_rvalue(ir_rvalue **rvalue)
{
   if (!*rvalue)
      return;

   ir_dereference *deref = (*rvalue)->as_dereference();

   if (!deref)
      return;

   split_deref(&deref);
   *rvalue = deref;
}